

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O1

int Gia_ObjUnrReadCopy0(Gia_ManUnr_t *p,Gia_Obj_t *pObj,int Id)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  uint uVar6;
  
  if (-1 < Id) {
    uVar3 = Id * 2;
    uVar4 = p->vDegDiff->nSize;
    if (uVar4 != uVar3 && SBORROW4(uVar4,uVar3) == (int)(uVar4 + Id * -2) < 0) {
      uVar6 = *(uint *)pObj & 0x1fffffff;
      uVar4 = Id - uVar6;
      if ((-1 < (int)uVar4) && ((int)uVar4 < p->vFirst->nSize)) {
        iVar1 = p->vFirst->pArray[uVar4];
        if (((long)iVar1 < 0) || (p->vStore->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        uVar4 = 0;
        if (Id != uVar6) {
          iVar2 = p->vDegDiff->pArray[uVar3];
          if ((iVar2 < 0) || (piVar5 = p->vStore->pArray + iVar1, *piVar5 <= iVar2)) {
            __assert_fail("Degree >= 0 && Degree < pArray[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFrames.c"
                          ,0x15b,"int Gia_ObjUnrRead(Gia_ManUnr_t *, int, int)");
          }
          uVar4 = piVar5[iVar2 + (uint)(iVar2 == 0)];
        }
        if (-1 < (int)uVar4) {
          return uVar4 ^ *(uint *)pObj >> 0x1d & 1;
        }
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Gia_ObjUnrReadCopy0( Gia_ManUnr_t * p, Gia_Obj_t * pObj, int Id )  
{
    int Lit = Gia_ObjUnrRead(p, Gia_ObjFaninId0(pObj, Id), Vec_IntEntry(p->vDegDiff, 2*Id));
    return Abc_LitNotCond( Lit, Gia_ObjFaninC0(pObj) );
}